

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O2

FT_Error split_sdf_conic(FT_Memory memory,FT_26D6_Vec *control_points,FT_UInt max_splits,
                        SDF_Edge **out)

{
  FT_Error FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FT_26D6_Vec cpos [5];
  SDF_Edge *right;
  SDF_Edge *left;
  FT_26D6_Vec local_78;
  undefined8 local_68;
  long lStack_60;
  FT_26D6_Vec local_58;
  int local_48;
  int iStack_44;
  undefined8 local_38;
  long lStack_30;
  
  if (out != (SDF_Edge **)0x0) {
    local_78.x = control_points->x;
    local_78.y = control_points->y;
    lStack_60 = control_points[1].y;
    local_58.y = control_points[2].y;
    iVar3 = (int)(local_78.y + lStack_60);
    iVar2 = (int)(lStack_60 + local_58.y);
    iVar4 = iVar2 / 2;
    local_38 = CONCAT44(-(uint)(iVar4 < 0),iVar4);
    iVar2 = iVar2 + iVar3;
    iVar2 = (int)(((uint)(iVar2 >> 0x1f) >> 0x1e) + iVar2) >> 2;
    _local_48 = CONCAT44(-(uint)(iVar2 < 0),iVar2);
    iVar2 = (int)(local_78.x + control_points[1].x) / 2;
    iVar3 = iVar3 / 2;
    local_68 = CONCAT44(-(uint)(iVar2 < 0),iVar2);
    local_58.x = CONCAT44(-(uint)(iVar3 < 0),iVar3);
    lStack_30 = local_58.y;
    if (max_splits < 3) {
      FVar1 = sdf_edge_new(memory,&left);
      if (FVar1 == 0) {
        FVar1 = sdf_edge_new(memory,&right);
        if (FVar1 == 0) {
          (left->start_pos).x = local_78.x;
          (left->start_pos).y = local_78.y;
          (left->end_pos).x = local_58.x;
          (left->end_pos).y = local_58.y;
          left->edge_type = SDF_EDGE_LINE;
          (right->start_pos).x = local_58.x;
          (right->start_pos).y = local_58.y;
          (right->end_pos).x = local_38;
          (right->end_pos).y = lStack_30;
          right->edge_type = SDF_EDGE_LINE;
          left->next = right;
          right->next = *out;
          *out = left;
          FVar1 = 0;
        }
      }
    }
    else {
      FVar1 = split_sdf_conic(memory,&local_78,max_splits >> 1,out);
      if (FVar1 == 0) {
        FVar1 = split_sdf_conic(memory,&local_58,max_splits >> 1,out);
      }
    }
    return FVar1;
  }
  return 6;
}

Assistant:

static FT_Error
  split_sdf_conic( FT_Memory     memory,
                   FT_26D6_Vec*  control_points,
                   FT_UInt       max_splits,
                   SDF_Edge**    out )
  {
    FT_Error     error = FT_Err_Ok;
    FT_26D6_Vec  cpos[5];
    SDF_Edge*    left,*  right;


    if ( !memory || !out  )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* split conic outline */
    cpos[0] = control_points[0];
    cpos[1] = control_points[1];
    cpos[2] = control_points[2];

    split_conic( cpos );

    /* If max number of splits is done */
    /* then stop and add the lines to  */
    /* the list.                       */
    if ( max_splits <= 2 )
      goto Append;

    /* Otherwise keep splitting. */
    FT_CALL( split_sdf_conic( memory, &cpos[0], max_splits / 2, out ) );
    FT_CALL( split_sdf_conic( memory, &cpos[2], max_splits / 2, out ) );

    /* [NOTE]: This is not an efficient way of   */
    /* splitting the curve.  Check the deviation */
    /* instead and stop if the deviation is less */
    /* than a pixel.                             */

    goto Exit;

  Append:
    /* Do allocation and add the lines to the list. */

    FT_CALL( sdf_edge_new( memory, &left ) );
    FT_CALL( sdf_edge_new( memory, &right ) );

    left->start_pos  = cpos[0];
    left->end_pos    = cpos[2];
    left->edge_type  = SDF_EDGE_LINE;

    right->start_pos = cpos[2];
    right->end_pos   = cpos[4];
    right->edge_type = SDF_EDGE_LINE;

    left->next  = right;
    right->next = (*out);
    *out        = left;

  Exit:
    return error;
  }